

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O2

TestReturnValue __thiscall
embree::MemoryMonitorTest::run(MemoryMonitorTest *this,VerifyApplication *state,bool silent)

{
  vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_> *this_00;
  thread_func p_Var1;
  bool bVar2;
  RTCError code;
  uint uVar3;
  RTCDevice userPtr;
  undefined8 *puVar4;
  ulong uVar5;
  int sse2;
  uint sceneIndex;
  ulong uVar6;
  float fVar7;
  TestReturnValue local_dc;
  RTCDeviceRef device;
  RegressionTask task2;
  RegressionTask task1;
  string cfg;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&task1,
                 &(state->super_Application).rtcore,",isa=");
  stringOfISA_abi_cxx11_((string *)&task2,(embree *)(ulong)(uint)(this->super_Test).sse2,sse2);
  std::operator+(&cfg,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&task1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&task2);
  std::__cxx11::string::~string((string *)&task2);
  std::__cxx11::string::~string((string *)&task1);
  userPtr = (RTCDevice)rtcNewDevice(cfg._M_dataplus._M_p);
  device.device = userPtr;
  code = rtcGetDeviceError();
  errorHandler(userPtr,code,(char *)0x0);
  this_00 = &this->intersectModes;
  task1.sceneIndex = 1;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
  emplace_back<embree::IntersectMode>(this_00,&task1.sceneIndex);
  task1.sceneIndex = 2;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
  emplace_back<embree::IntersectMode>(this_00,&task1.sceneIndex);
  task1.sceneIndex = 3;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
  emplace_back<embree::IntersectMode>(this_00,&task1.sceneIndex);
  task1.sceneIndex = 4;
  std::vector<embree::IntersectMode,_std::allocator<embree::IntersectMode>_>::
  emplace_back<embree::IntersectMode>(this_00,&task1.sceneIndex);
  uVar6 = 0;
  rtcSetDeviceMemoryMonitorFunction(device.device,monitorMemoryFunction,0);
  do {
    sceneIndex = (uint)uVar6;
    fVar7 = this->intensity * state->intensity;
    uVar5 = (ulong)fVar7;
    if (((long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5) <= uVar6) {
      rtcSetDeviceMemoryMonitorFunction(device.device,0,0);
      AssertNoError(device.device);
      local_dc = PASSED;
      break;
    }
    monitorMemoryBreak = 0xffffffffffffffff;
    LOCK();
    monitorMemoryBytesUsed = 0;
    UNLOCK();
    LOCK();
    monitorMemoryInvokations = 0;
    UNLOCK();
    LOCK();
    monitorMemoryBreakExecuted = 0;
    UNLOCK();
    monitorProgressBreak = 0xffffffffffffffff;
    LOCK();
    monitorProgressInvokations = 0;
    UNLOCK();
    LOCK();
    monitorProgressBreakExecuted = 0;
    UNLOCK();
    RegressionTask::RegressionTask(&task1,&this->super_Test,sceneIndex,1,0,true);
    p_Var1 = this->func;
    puVar4 = (undefined8 *)operator_new(0x28);
    *puVar4 = 0;
    puVar4[1] = state;
    puVar4[2] = &device;
    puVar4[3] = this_00;
    puVar4[4] = &task1;
    (*p_Var1)(puVar4);
    if (monitorMemoryBytesUsed == 0) {
      uVar3 = (this->super_Test).sampler.s * 0x19660d + 0x3c6ef35f;
      (this->super_Test).sampler.s = uVar3;
      fVar7 = (float)(uVar3 >> 1) * 4.656613e-10 * (float)monitorMemoryInvokations;
      uVar5 = (ulong)fVar7;
      monitorMemoryBreak = (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      LOCK();
      monitorMemoryBytesUsed = 0;
      UNLOCK();
      LOCK();
      monitorMemoryInvokations = 0;
      UNLOCK();
      LOCK();
      monitorMemoryBreakExecuted = 0;
      UNLOCK();
      uVar3 = (this->super_Test).sampler.s * 0x19660d + 0x3c6ef35f;
      (this->super_Test).sampler.s = uVar3;
      fVar7 = ((float)monitorProgressInvokations + (float)monitorProgressInvokations) *
              (float)(uVar3 >> 1) * 4.656613e-10;
      uVar5 = (ulong)fVar7;
      monitorProgressBreak = (long)(fVar7 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5;
      LOCK();
      monitorProgressInvokations = 0;
      UNLOCK();
      LOCK();
      monitorProgressBreakExecuted = 0;
      UNLOCK();
      RegressionTask::RegressionTask(&task2,&this->super_Test,sceneIndex,1,0,true);
      p_Var1 = this->func;
      puVar4 = (undefined8 *)operator_new(0x28);
      *puVar4 = 0;
      puVar4[1] = state;
      puVar4[2] = &device;
      puVar4[3] = this_00;
      puVar4[4] = &task2;
      (*p_Var1)(puVar4);
      if ((((monitorMemoryBytesUsed == 0) &&
           ((monitorMemoryBreakExecuted == 0 ||
            (task2.errorCounter.super___atomic_base<unsigned_long>._M_i == 1)))) &&
          ((monitorProgressBreakExecuted == 0 ||
           (task2.errorCounter.super___atomic_base<unsigned_long>._M_i == 1)))) &&
         (((monitorMemoryBreakExecuted != 0 || (monitorProgressBreakExecuted != 0)) ||
          (task2.errorCounter.super___atomic_base<unsigned_long>._M_i == 0)))) {
        uVar6 = (ulong)(sceneIndex + 1);
        bVar2 = true;
      }
      else {
        bVar2 = false;
      }
      RegressionTask::~RegressionTask(&task2);
    }
    else {
      bVar2 = false;
    }
    local_dc = FAILED;
    RegressionTask::~RegressionTask(&task1);
  } while (bVar2);
  RTCDeviceRef::~RTCDeviceRef(&device);
  std::__cxx11::string::~string((string *)&cfg);
  return local_dc;
}

Assistant:

VerifyApplication::TestReturnValue run(VerifyApplication* state, bool silent)
    {
      std::string cfg = state->rtcore + ",isa="+stringOfISA(isa);
      RTCDeviceRef device = rtcNewDevice(cfg.c_str());
      errorHandler(nullptr,rtcGetDeviceError(device));
      
      /* only test supported intersect modes */
      intersectModes.push_back(MODE_INTERSECT1);
      intersectModes.push_back(MODE_INTERSECT4);
      intersectModes.push_back(MODE_INTERSECT8);
      intersectModes.push_back(MODE_INTERSECT16);
      
      rtcSetDeviceMemoryMonitorFunction(device,monitorMemoryFunction,nullptr);
      
      unsigned int sceneIndex = 0;
      while (sceneIndex < size_t(intensity*state->intensity)) 
      {
        monitorMemoryBreak = std::numeric_limits<size_t>::max();
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = std::numeric_limits<size_t>::max();
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task1(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task1));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;

        monitorMemoryBreak = size_t(float(monitorMemoryInvokations) * random_float());
        monitorMemoryBytesUsed = 0;
        monitorMemoryInvokations = 0;
        monitorMemoryBreakExecuted = 0;
        monitorProgressBreak = size_t(float(monitorProgressInvokations) * 2.0f * random_float());
        monitorProgressInvokations = 0;
        monitorProgressBreakExecuted = 0;
        RegressionTask task2(this,sceneIndex,1,0,true);
        func(new ThreadRegressionTask(0,0,state,device,intersectModes,&task2));
        if (monitorMemoryBytesUsed) 
          return VerifyApplication::FAILED;
        if (monitorMemoryBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (monitorProgressBreakExecuted && task2.errorCounter != 1) 
          return VerifyApplication::FAILED;
        if (!monitorMemoryBreakExecuted && !monitorProgressBreakExecuted && task2.errorCounter != 0) 
          return VerifyApplication::FAILED;
        sceneIndex++;
      }
      rtcSetDeviceMemoryMonitorFunction(device,nullptr,nullptr);
      AssertNoError(device);
      return VerifyApplication::PASSED;
    }